

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O0

bool __thiscall OSSLRSAPrivateKey::PKCS8Decode(OSSLRSAPrivateKey *this,ByteString *ber)

{
  size_t sVar1;
  PKCS8_PRIV_KEY_INFO *p8_00;
  EVP_PKEY *pkey_00;
  rsa_st *r;
  ByteString *in_RDI;
  RSA *key;
  EVP_PKEY *pkey;
  PKCS8_PRIV_KEY_INFO *p8;
  uchar *priv;
  int len;
  uchar *local_28;
  int local_1c;
  bool local_1;
  
  sVar1 = ByteString::size((ByteString *)0x1c32e1);
  local_1c = (int)sVar1;
  if (local_1c < 1) {
    local_1 = false;
  }
  else {
    local_28 = ByteString::const_byte_str(in_RDI);
    p8_00 = d2i_PKCS8_PRIV_KEY_INFO((PKCS8_PRIV_KEY_INFO **)0x0,&local_28,(long)local_1c);
    if (p8_00 == (PKCS8_PRIV_KEY_INFO *)0x0) {
      local_1 = false;
    }
    else {
      pkey_00 = EVP_PKCS82PKEY(p8_00);
      PKCS8_PRIV_KEY_INFO_free(p8_00);
      if (pkey_00 == (EVP_PKEY *)0x0) {
        local_1 = false;
      }
      else {
        r = EVP_PKEY_get1_RSA(pkey_00);
        EVP_PKEY_free(pkey_00);
        if (r == (rsa_st *)0x0) {
          local_1 = false;
        }
        else {
          (*in_RDI->_vptr_ByteString[0x19])(in_RDI,r);
          RSA_free(r);
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool OSSLRSAPrivateKey::PKCS8Decode(const ByteString& ber)
{
	int len = ber.size();
	if (len <= 0) return false;
	const unsigned char* priv = ber.const_byte_str();
	PKCS8_PRIV_KEY_INFO* p8 = d2i_PKCS8_PRIV_KEY_INFO(NULL, &priv, len);
	if (p8 == NULL) return false;
	EVP_PKEY* pkey = EVP_PKCS82PKEY(p8);
	PKCS8_PRIV_KEY_INFO_free(p8);
	if (pkey == NULL) return false;
	RSA* key = EVP_PKEY_get1_RSA(pkey);
	EVP_PKEY_free(pkey);
	if (key == NULL) return false;
	setFromOSSL(key);
	RSA_free(key);
	return true;
}